

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

Am_Wrapper * dialog_items_proc(Am_Object *self)

{
  Am_Value *this;
  Am_Wrapper *pAVar1;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *self_local;
  
  local_10 = self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  this = Am_Object::Get(&local_18,0xa2,0);
  pAVar1 = Am_Value::operator_cast_to_Am_Wrapper_(this);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_20);
  return pAVar1;
}

Assistant:

Am_Define_Formula(Am_Wrapper *, dialog_items)
{
  return self.Get_Owner().Get_Owner().Get(Am_ITEMS);
}